

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenericBlendersTests.cpp
# Opt level: O3

void __thiscall
agge::tests::GenericRGBXBlenderTests::BlendingWhiteOnBlackProducesGrayDependingOnCover
          (GenericRGBXBlenderTests *this)

{
  color cVar1;
  long lVar2;
  FailedAssertion *this_00;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  pixel dest [7];
  undefined8 local_b8;
  undefined1 uStack_b0;
  undefined1 uStack_af;
  undefined1 uStack_ae;
  undefined1 uStack_ad;
  undefined1 uStack_ac;
  undefined1 uStack_ab;
  undefined1 uStack_aa;
  undefined1 uStack_a9;
  undefined1 local_a8;
  undefined1 local_a7;
  undefined1 local_a6;
  undefined1 uStack_a5;
  undefined8 local_a4;
  string local_90;
  string local_70;
  LocationInfo local_50;
  
  cVar1 = color::make(0xff,0xff,0xff,0xff);
  iVar3 = ((uint)cVar1 >> 0x18) * 0x40 + (((uint)cVar1 >> 0x18) * 0x1f9) / 1000;
  uVar6 = (uint)cVar1 & 0xff;
  uVar4 = (uint)cVar1 >> 8 & 0xff;
  uVar5 = (uint)cVar1 >> 0x10 & 0xff;
  iVar7 = iVar3 * 0x12;
  uStack_ad = 0;
  uStack_a9 = 0;
  uStack_a5 = 0;
  local_b8 = (ulong)CONCAT12((char)(iVar7 * uVar5 >> 0x16),
                             CONCAT11((char)(uVar4 * iVar7 >> 0x16),(char)(uVar6 * iVar7 >> 0x16)))
             << 0x20;
  iVar7 = iVar3 * 0x21;
  uStack_b0 = (undefined1)(uVar6 * iVar7 >> 0x16);
  uStack_af = (undefined1)(uVar4 * iVar7 >> 0x16);
  uStack_ae = (undefined1)(iVar7 * uVar5 >> 0x16);
  iVar7 = iVar3 * 0x71;
  uStack_ac = (undefined1)(uVar6 * iVar7 >> 0x16);
  uStack_ab = (undefined1)(uVar4 * iVar7 >> 0x16);
  uStack_aa = (undefined1)(iVar7 * uVar5 >> 0x16);
  iVar7 = iVar3 * 0x81;
  local_a8 = (undefined1)(uVar6 * iVar7 >> 0x16);
  local_a7 = (undefined1)(uVar4 * iVar7 >> 0x16);
  local_a6 = (undefined1)(iVar7 * uVar5 >> 0x16);
  iVar7 = iVar3 * 0xf0;
  local_a4._0_4_ =
       (uint)CONCAT12((char)(iVar7 * uVar5 >> 0x16),
                      CONCAT11((char)(uVar4 * iVar7 >> 0x16),(char)(uVar6 * iVar7 >> 0x16)));
  if (iVar3 == 0x4040) {
    local_a4._0_5_ = CONCAT14(cVar1.r,(uint)local_a4);
    local_a4._0_6_ = CONCAT15(cVar1.g,(undefined5)local_a4);
    local_a4._0_7_ = CONCAT16(cVar1.b,(undefined6)local_a4);
  }
  else {
    iVar3 = iVar3 * 0xff;
    local_a4._0_5_ = CONCAT14((char)(uVar6 * iVar3 >> 0x16),(uint)local_a4);
    local_a4._0_6_ = CONCAT15((char)(uVar4 * iVar3 >> 0x16),(undefined5)local_a4);
    local_a4._0_7_ = CONCAT16((char)(uVar5 * iVar3 >> 0x16),(undefined6)local_a4);
  }
  local_a4 = (ulong)(uint7)local_a4;
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_90,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/GenericBlendersTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo(&local_50,&local_90,0x3e);
  lVar2 = 0;
  while( true ) {
    if ((((&DAT_0019f480)[lVar2] != *(char *)((long)&local_b8 + lVar2)) ||
        ((&DAT_0019f481)[lVar2] != *(char *)((long)&local_b8 + lVar2 + 1))) ||
       ((&DAT_0019f482)[lVar2] != *(char *)((long)&local_b8 + lVar2 + 2))) break;
    lVar2 = lVar2 + 4;
    if (lVar2 == 0x1c) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50.filename._M_dataplus._M_p != &local_50.filename.field_2) {
        operator_delete(local_50.filename._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p);
      }
      return;
    }
  }
  this_00 = (FailedAssertion *)__cxa_allocate_exception(0x38);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"Value is not \'true\'!","");
  ut::FailedAssertion::FailedAssertion(this_00,&local_70,&local_50);
  __cxa_throw(this_00,&ut::FailedAssertion::typeinfo,ut::FailedAssertion::~FailedAssertion);
}

Assistant:

test( BlendingWhiteOnBlackProducesGrayDependingOnCover )
			{
				typedef mocks::pixel_rgbx<order_rgba> pixel;

				// INIT
				const int n = 7;
				const pixel black = { };
				const uint8_t covers[n] = { 0x00, 0x12, 0x21, 0x71, 0x81, 0xF0, 0xFF };
				blender_solid_color_rgb<pixel, order_rgba> whiteness(color::make(0xFF, 0xFF, 0xFF));
				pixel dest[n];

				fill_n(dest, n, black);

				// ACT
				whiteness(dest + 0, 0, 0, 1, covers + 0);
				whiteness(dest + 1, 0, 0, 1, covers + 1);
				whiteness(dest + 2, 0, 0, 1, covers + 2);
				whiteness(dest + 3, 0, 0, 1, covers + 3);
				whiteness(dest + 4, 0, 0, 1, covers + 4);
				whiteness(dest + 5, 0, 0, 1, covers + 5);
				whiteness(dest + 6, 0, 0, 1, covers + 6);

				// ASSERT
				pixel reference[] = {
					{ { 0x00, 0x00, 0x00, 0x00 } },
					{ { 0x11, 0x11, 0x11, 0x11 } },
					{ { 0x20, 0x20, 0x20, 0x20 } },
					{ { 0x70, 0x70, 0x70, 0x70 } },
					{ { 0x80, 0x80, 0x80, 0x80 } },
					{ { 0xEF, 0xEF, 0xEF, 0xEF } },
					{ { 0xFF, 0xFF, 0xFF, 0xFF } },
				};

				assert_equal(reference, dest);
			}